

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>,_bool>
* __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
::insert_hint_unique<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>,_bool>
           *__return_storage_ptr__,
          btree<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
          *this,iterator position,key_type *key,
          pair<const_int,_phmap::test_internal::MovableOnlyInstance> *args)

{
  pair<const_int,_phmap::test_internal::MovableOnlyInstance> *ppVar1;
  bool bVar2;
  key_type *pkVar3;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
  *this_00;
  iterator iter;
  iterator iVar4;
  bool local_14a;
  bool local_149;
  bool local_139;
  bool local_11a;
  bool local_119;
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
  *local_118;
  int local_110;
  btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
  *local_108;
  int iStack_100;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
  local_f0;
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
  *local_e0;
  int local_d8;
  iterator local_d0;
  bool local_b9;
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
  *local_b8;
  int local_b0;
  btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
  *local_a8;
  int iStack_a0;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
  local_98;
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
  *local_88;
  int local_80;
  iterator local_78;
  undefined1 auStack_68 [8];
  iterator prev;
  iterator local_40;
  pair<const_int,_phmap::test_internal::MovableOnlyInstance> *local_30;
  pair<const_int,_phmap::test_internal::MovableOnlyInstance> *args_local;
  key_type *key_local;
  btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
  *this_local;
  iterator position_local;
  
  this_local = (btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                *)position.node;
  position_local.node._0_4_ = position.position;
  local_30 = args;
  args_local = (pair<const_int,_phmap::test_internal::MovableOnlyInstance> *)key;
  key_local = (key_type *)this;
  bVar2 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
          ::empty((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                   *)this);
  if (!bVar2) {
    iVar4 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
            ::end((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                   *)this);
    local_40.node = iVar4.node;
    local_40.position = iVar4.position;
    bVar2 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
            ::operator==((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                          *)&this_local,&local_40);
    ppVar1 = args_local;
    local_139 = true;
    if (!bVar2) {
      pkVar3 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
               ::key((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                      *)&this_local);
      local_139 = compare_keys<int,int>(this,&ppVar1->first,pkVar3);
    }
    if (local_139 == false) {
      pkVar3 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
               ::key((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                      *)&this_local);
      bVar2 = compare_keys<int,int>(this,pkVar3,&args_local->first);
      if (!bVar2) {
        local_11a = false;
        std::
        pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>,_bool>
        ::
        pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>_&,_bool,_true>
                  (__return_storage_ptr__,
                   (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                    *)&this_local,&local_11a);
        return __return_storage_ptr__;
      }
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
      ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                    *)&this_local);
      iVar4 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
              ::end((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                     *)this);
      local_e0 = iVar4.node;
      local_d8 = iVar4.position;
      local_d0.node = local_e0;
      local_d0.position = local_d8;
      bVar2 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
              ::operator==((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                            *)&this_local,&local_d0);
      ppVar1 = args_local;
      local_14a = true;
      if (!bVar2) {
        pkVar3 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                 ::key((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                        *)&this_local);
        local_14a = compare_keys<int,int>(this,&ppVar1->first,pkVar3);
      }
      if (local_14a != false) {
        local_108 = this_local;
        iStack_100 = (int)position_local.node;
        iter.position = (int)position_local.node;
        iter.node = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                     *)this_local;
        iter._12_4_ = 0;
        iVar4 = internal_emplace<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
                          (this,iter,local_30);
        local_118 = iVar4.node;
        local_110 = iVar4.position;
        local_119 = true;
        local_f0.node = local_118;
        local_f0.position = local_110;
        std::
        pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>,_bool>
        ::
        pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>,_bool,_true>
                  (__return_storage_ptr__,&local_f0,&local_119);
        return __return_storage_ptr__;
      }
    }
    else {
      prev.node = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                   *)CONCAT44(position_local.node._4_4_,(int)position_local.node);
      auStack_68 = (undefined1  [8])this_local;
      iVar4 = btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
              ::begin((btree<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                       *)this);
      local_88 = iVar4.node;
      local_80 = iVar4.position;
      local_78.node = local_88;
      local_78.position = local_80;
      bVar2 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
              ::operator==((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                            *)&this_local,&local_78);
      local_149 = true;
      if (!bVar2) {
        this_00 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                  ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                                *)auStack_68);
        pkVar3 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>
                 ::key(this_00);
        local_149 = compare_keys<int,int>(this,pkVar3,&args_local->first);
      }
      if (local_149 != false) {
        local_a8 = this_local;
        iStack_a0 = (int)position_local.node;
        iVar4.position = (int)position_local.node;
        iVar4.node = (btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                      *)this_local;
        iVar4._12_4_ = 0;
        iVar4 = internal_emplace<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
                          (this,iVar4,local_30);
        local_b8 = iVar4.node;
        local_b0 = iVar4.position;
        local_b9 = true;
        local_98.node = local_b8;
        local_98.position = local_b0;
        std::
        pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>,_bool>
        ::
        pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_&,_std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_*>,_bool,_true>
                  (__return_storage_ptr__,&local_98,&local_b9);
        return __return_storage_ptr__;
      }
    }
  }
  insert_unique<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>
            (__return_storage_ptr__,this,&args_local->first,local_30);
  return __return_storage_ptr__;
}

Assistant:

inline auto btree<P>::insert_hint_unique(iterator position, const key_type &key,
                                             Args &&... args)
        -> std::pair<iterator, bool> {
        if (!empty()) {
            if (position == end() || compare_keys(key, position.key())) {
                iterator prev = position;
                if (position == begin() || compare_keys((--prev).key(), key)) {
                    // prev.key() < key < position.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else if (compare_keys(position.key(), key)) {
                ++position;
                if (position == end() || compare_keys(key, position.key())) {
                    // {original `position`}.key() < key < {current `position`}.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else {
                // position.key() == key
                return {position, false};
            }
        }
        return insert_unique(key, std::forward<Args>(args)...);
    }